

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall nnad::Matrix<double>::Display(Matrix<double> *this)

{
  ostream *poVar1;
  int *in_RDI;
  double dVar2;
  int j;
  int i;
  int *in_stack_00000060;
  int *in_stack_00000068;
  Matrix<double> *in_stack_00000070;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < in_RDI[1]; local_10 = local_10 + 1) {
      dVar2 = GetElement(in_stack_00000070,in_stack_00000068,in_stack_00000060);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar2);
      std::operator<<(poVar1," ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Display()
    {
      for (int i = 0; i < _Lines; i++)
        {
          for (int j = 0; j < _Columns; j++)
            std::cout << this->GetElement(i,j) << " ";
          std::cout << std::endl;
        }
      std::cout << std::endl;
    }